

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdCall(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  uint uVar1;
  uint uVar2;
  x86XmmReg reg1;
  uint *puVar3;
  uchar resultType;
  uchar resultReg;
  uint *microcode;
  x86XmmReg destination;
  x86XmmReg source;
  uchar resultReg_1;
  uint sourceReg;
  uint *microcode_1;
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._4_4_ = cmd.argument;
  ctx_local._1_1_ = cmd.rA;
  ctx_local._2_1_ = cmd.rB;
  ctx_local._3_1_ = cmd.rC;
  if ((ctx_local._4_4_ != 0xffffffff) && (ctx->exFunctions[ctx_local._4_4_].builtinIndex == 1)) {
    puVar3 = ctx->exRegVmConstants +
             (int)((uint)ctx_local._1_1_ << 0x10 | (uint)ctx_local._2_1_ << 8 |
                  (uint)ctx_local._3_1_);
    if ((*puVar3 == 3) && ((uVar1 = puVar3[1], puVar3[2] == 5 && (puVar3[4] == 1)))) {
      uVar2 = puVar3[5];
      microcode._4_4_ =
           CodeGenGenericContext::FindXmmRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rEBX,uVar1 << 3,true);
      if (microcode._4_4_ == rXmmRegCount) {
        microcode._4_4_ = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
        EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,microcode._4_4_,sQWORD,rEBX,uVar1 << 3);
      }
      else {
        CodeGenGenericContext::LockXmmReg(&ctx->ctx,microcode._4_4_);
      }
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
      reg1 = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
      EMIT_OP_REG_REG(&ctx->ctx,o_sqrtsd,reg1,microcode._4_4_);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,rEBX,(uVar2 & 0xff) << 3,reg1);
      return;
    }
  }
  ctx->vmState->callWrap = CallWrap;
  puVar3 = GetCodeCmdCallPrologue
                     (ctx,(uint)ctx_local._1_1_ << 0x10 | (uint)ctx_local._2_1_ << 8 |
                          (uint)ctx_local._3_1_);
  uVar1 = *puVar3;
  uVar2 = puVar3[1];
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rR13,
                   ((int)ctx->vmState + 0x178) - (int)ctx->vmState);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEAX,ctx_local._4_4_ << 3);
  EMIT_OP_REG_NUM(&ctx->ctx,o_cmp64,rEAX,0);
  EMIT_OP_LABEL(&ctx->ctx,o_je,ctx->labelCount,0,0);
  EMIT_OP_REG(&ctx->ctx,o_call,rEAX);
  EMIT_OP_LABEL(&ctx->ctx,o_jmp,ctx->labelCount + 1,0,0);
  EMIT_LABEL(&ctx->ctx,ctx->labelCount,0);
  ctx->labelCount = ctx->labelCount + 1;
  EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rR13);
  EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rESI,ctx_local._4_4_);
  EMIT_REG_READ(&ctx->ctx,rEDI);
  EMIT_REG_READ(&ctx->ctx,rESI);
  EMIT_OP_RPTR(&ctx->ctx,o_call,sQWORD,rEDI,((int)ctx->vmState + 0xd0) - (int)ctx->vmState);
  EMIT_LABEL(&ctx->ctx,ctx->labelCount,0);
  ctx->labelCount = ctx->labelCount + 1;
  GetCodeCmdCallEpilogue(ctx,puVar3 + 2,(uchar)uVar1,(uchar)uVar2);
  return;
}

Assistant:

void GenCodeCmdCall(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	if(cmd.argument != ~0u && ctx.exFunctions[cmd.argument].builtinIndex == NULLC_BUILTIN_SQRT)
	{
		unsigned *microcode = ctx.exRegVmConstants + ((cmd.rA << 16) | (cmd.rB << 8) | cmd.rC);

		if(*microcode++ == rvmiPushQword)
		{
			unsigned sourceReg = *microcode++;

			if(*microcode++ == (NULLC_PTR_SIZE == 8 ? rvmiPushImmq : rvmiPushImm))
			{
				microcode++;

				if(*microcode++ == rvmiCall)
				{
					unsigned char resultReg = *microcode++ & 0xff;

					x86XmmReg source = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rREG, sourceReg * 8, true);

					if(source == rXmmRegCount)
					{
						source = ctx.ctx.GetXmmReg();

						EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, source, sQWORD, rREG, sourceReg * 8); // Load double value
					}
					else
					{
						ctx.ctx.LockXmmReg(source);
					}

					ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

					x86XmmReg destination = ctx.ctx.GetXmmReg();

					EMIT_OP_REG_REG(ctx.ctx, o_sqrtsd, destination, source);
					EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rREG, resultReg * 8, destination); // Store double to target

					return;
				}
			}
		}
	}

	ctx.vmState->callWrap = CallWrap;

	unsigned *microcode = GetCodeCmdCallPrologue(ctx, (cmd.rA << 16) | (cmd.rB << 8) | cmd.rC);

	unsigned char resultReg = *microcode++ & 0xff;
	unsigned char resultType = *microcode++ & 0xff;

#if defined(_M_X64)
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rR13, nullcOffsetOf(ctx.vmState, functionAddress));
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rRAX, cmd.argument * sizeof(void*));
	EMIT_OP_REG_NUM(ctx.ctx, o_cmp64, rRAX, 0);

	EMIT_OP_LABEL(ctx.ctx, o_je, ctx.labelCount, false);

	EMIT_OP_REG(ctx.ctx, o_call, rRAX);
	EMIT_OP_LABEL(ctx.ctx, o_jmp, ctx.labelCount + 1, false);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;

	EMIT_OP_REG_REG(ctx.ctx, o_mov64, rArg1, rR13);
	EMIT_OP_REG_NUM(ctx.ctx, o_mov, rArg2, cmd.argument);
	EMIT_REG_READ(ctx.ctx, rArg1);
	EMIT_REG_READ(ctx.ctx, rArg2);
	EMIT_OP_RPTR(ctx.ctx, o_call, sQWORD, rArg1, nullcOffsetOf(ctx.vmState, callWrap));

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;
#else
	EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, cmd.argument * sizeof(void*) + (uintptr_t)ctx.vmState->functionAddress);
	EMIT_OP_REG_NUM(ctx.ctx, o_cmp, rEAX, 0);

	EMIT_OP_LABEL(ctx.ctx, o_je, ctx.labelCount, false);

	EMIT_OP_REG(ctx.ctx, o_call, rEAX);
	EMIT_OP_LABEL(ctx.ctx, o_jmp, ctx.labelCount + 1, false);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;

	EMIT_OP_NUM(ctx.ctx, o_push, cmd.argument);
	EMIT_OP_NUM(ctx.ctx, o_push, uintptr_t(ctx.vmState));
	EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->callWrap));
	EMIT_OP_REG_NUM(ctx.ctx, o_add, rESP, 8);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;
#endif

	GetCodeCmdCallEpilogue(ctx, microcode, resultReg, resultType);
}